

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O2

CreatePegInAddressResponseStruct *
cfd::js::api::ElementsAddressStructApi::CreatePegInAddress
          (CreatePegInAddressResponseStruct *__return_storage_ptr__,
          CreatePegInAddressRequestStruct *request)

{
  string *in_R8;
  allocator local_159;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  function<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&)>
  local_138;
  CreatePegInAddressResponseStruct local_118;
  
  CreatePegInAddressResponseStruct::CreatePegInAddressResponseStruct(__return_storage_ptr__);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:178:20)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<cfd::js::api::CreatePegInAddressResponseStruct_(const_cfd::js::api::CreatePegInAddressRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:178:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_138,"CreatePegInAddress",&local_159);
  ExecuteStructApi<cfd::js::api::CreatePegInAddressRequestStruct,cfd::js::api::CreatePegInAddressResponseStruct>
            (&local_118,(api *)request,(CreatePegInAddressRequestStruct *)&local_158,&local_138,
             in_R8);
  CreatePegInAddressResponseStruct::operator=(__return_storage_ptr__,&local_118);
  CreatePegInAddressResponseStruct::~CreatePegInAddressResponseStruct(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

CreatePegInAddressResponseStruct ElementsAddressStructApi::CreatePegInAddress(
    const CreatePegInAddressRequestStruct& request) {
  auto call_func = [](const CreatePegInAddressRequestStruct& request)
      -> CreatePegInAddressResponseStruct {  // NOLINT
    CreatePegInAddressResponseStruct response;

    // convert request arguments from struct
    Script fedpegscript = Script(request.fedpegscript);
    // Pubkey pubkey = Pubkey(request.pubkey);
    NetType net_type = AddressStructApi::ConvertNetType(request.network);
    AddressType address_type =
        AddressApiBase::ConvertAddressType(request.hash_type);

    // prepare output parameters
    Script claim_script;
    Script tweak_fedpegscript;
    Pubkey pubkey;
    Script redeem_script;
    if (!request.redeem_script.empty()) {
      redeem_script = Script(request.redeem_script);
    } else {
      pubkey = Pubkey(request.pubkey);
    }

    ElementsAddressApi api;
    Address pegin_address = api.CreatePegInAddress(
        net_type, address_type, fedpegscript, pubkey, redeem_script,
        &claim_script, &tweak_fedpegscript);

    // convert parameters to response struct
    response.mainchain_address = pegin_address.GetAddress();
    if (claim_script.IsEmpty()) {
      response.ignore_items.insert("claimScript");
    } else {
      response.claim_script = claim_script.GetHex();
    }
    if (tweak_fedpegscript.IsEmpty()) {
      response.ignore_items.insert("tweakFedpegscript");
    } else {
      response.tweak_fedpegscript = tweak_fedpegscript.GetHex();
    }
    return response;
  };

  CreatePegInAddressResponseStruct result;
  result = ExecuteStructApi<
      CreatePegInAddressRequestStruct, CreatePegInAddressResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}